

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP_MPI.h
# Opt level: O0

void __thiscall CCDPP_MPI::train(CCDPP_MPI *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  ulong uVar5;
  mapped_type *pmVar6;
  size_type sVar7;
  reference pRVar8;
  ostream *poVar9;
  void *pvVar10;
  double *pdVar11;
  long in_RDI;
  double dVar12;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  value_type_conflict1 vVar13;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  value_type_conflict1 obj_1;
  value_type_conflict1 global_loss_1;
  value_type_conflict1 global_reg_1;
  value_type_conflict1 c_1;
  int user_index_1;
  value_type_conflict1 c;
  int item_index;
  value_type_conflict1 loss_1;
  int inner_iter;
  value_type_conflict1 global_innerfundec_cur;
  value_type_conflict1 innerfundec_cur;
  value_type_conflict1 *p4d;
  value_type_conflict1 *q4d;
  int d_1;
  value_type_conflict1 fundec_max;
  int early_stop;
  int outer_iter;
  value_type_conflict1 total_training_time;
  Monitor timer;
  value_type_conflict1 obj;
  value_type_conflict1 global_loss;
  value_type_conflict1 global_reg;
  value_type_conflict1 score;
  Rating rating;
  iterator __end2;
  iterator __begin2;
  vector<Rating,_std::allocator<Rating>_> *__range2;
  value_type_conflict1 loss;
  int user_index;
  int d;
  value_type_conflict1 prev_obj;
  value_type_conflict1 reg;
  value_type_conflict1 *v;
  value_type_conflict1 *u;
  value_type_conflict1 *last_p4d;
  value_type_conflict1 *last_q4d;
  vector<Rating,_std::allocator<Rating>_> *in_stack_fffffffffffffd58;
  undefined4 uVar41;
  key_type *__k;
  unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
  *in_stack_fffffffffffffd60;
  ostream *in_stack_fffffffffffffe00;
  ostream *in_stack_fffffffffffffe08;
  ostream *in_stack_fffffffffffffe10;
  ostream *in_stack_fffffffffffffe18;
  CCDPP_MPI *in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
  *in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
  *in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  value_type_conflict1 local_138;
  int local_12c;
  double local_128;
  double local_120;
  long local_118;
  long local_110;
  int local_f4;
  double local_f0;
  int local_e8;
  int local_e4;
  double local_e0;
  Monitor local_d8;
  double local_a0;
  double local_98;
  double local_90;
  value_type_conflict1 local_88;
  undefined8 local_80;
  undefined8 local_78;
  value_type_conflict1 local_70;
  Rating *local_68;
  __normal_iterator<Rating_*,_std::vector<Rating,_std::allocator<Rating>_>_> local_60;
  long local_58;
  ulong local_50;
  int local_44;
  int local_40;
  int local_3c;
  double local_38;
  ulong local_30;
  void *local_28;
  void *local_20;
  void *local_18;
  void *local_10;
  
  auVar18._8_8_ = 0;
  auVar18._0_8_ = (long)*(int *)(in_RDI + 0x18);
  uVar5 = SUB168(auVar18 * ZEXT816(8),0);
  if (SUB168(auVar18 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  local_10 = operator_new__(uVar5);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)*(int *)(in_RDI + 0x1c);
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  local_18 = operator_new__(uVar5);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)*(int *)(in_RDI + 8);
  uVar5 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  local_20 = operator_new__(uVar5);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)*(int *)(in_RDI + 0xc);
  uVar5 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  local_28 = operator_new__(uVar5);
  local_30 = 0;
  local_38 = 0.0;
  if ((*(byte *)(*(long *)(in_RDI + 0x38) + 0x69) & 1) != 0) {
    for (local_3c = 0; local_3c < **(int **)(in_RDI + 0x38); local_3c = local_3c + 1) {
      for (local_40 = 0; local_40 < *(int *)(in_RDI + 0x2c) - *(int *)(in_RDI + 0x28);
          local_40 = local_40 + 1) {
        dVar12 = *(double *)
                  (*(long *)(in_RDI + 0x40) +
                  (long)(local_3c * *(int *)(in_RDI + 0x18) + local_40) * 8) *
                 *(double *)
                  (*(long *)(in_RDI + 0x40) +
                  (long)(local_3c * *(int *)(in_RDI + 0x18) + local_40) * 8);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = dVar12;
        local_44 = local_40 + *(int *)(in_RDI + 0x28);
        pmVar6 = std::
                 unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                 ::operator[](in_stack_fffffffffffffd60,(key_type *)in_stack_fffffffffffffd58);
        sVar7 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                          (pmVar6);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dVar12;
        auVar18 = vcvtusi2sd_avx512f(auVar15,sVar7);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = local_30;
        auVar18 = vfmadd213sd_fma(auVar18,auVar25,auVar33);
        local_30 = auVar18._0_8_;
      }
    }
    local_50 = 0;
    local_58 = in_RDI + 0xc0;
    local_60._M_current =
         (Rating *)std::vector<Rating,_std::allocator<Rating>_>::begin(in_stack_fffffffffffffd58);
    local_68 = (Rating *)
               std::vector<Rating,_std::allocator<Rating>_>::end(in_stack_fffffffffffffd58);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<Rating_*,_std::vector<Rating,_std::allocator<Rating>_>_>
                               *)in_stack_fffffffffffffd60,
                              (__normal_iterator<Rating_*,_std::vector<Rating,_std::allocator<Rating>_>_>
                               *)in_stack_fffffffffffffd58), bVar4) {
      pRVar8 = __gnu_cxx::__normal_iterator<Rating_*,_std::vector<Rating,_std::allocator<Rating>_>_>
               ::operator*(&local_60);
      local_80._0_4_ = pRVar8->global_id;
      local_80._4_4_ = pRVar8->user_id;
      local_78 = *(undefined8 *)&pRVar8->item_id;
      local_88 = pRVar8->score;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_88;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_88;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_50;
      auVar18 = vfmadd213sd_fma(auVar16,auVar26,auVar34);
      local_50 = auVar18._0_8_;
      local_70 = local_88;
      __gnu_cxx::__normal_iterator<Rating_*,_std::vector<Rating,_std::allocator<Rating>_>_>::
      operator++(&local_60);
    }
    MPI_Allreduce(&local_30,&local_90,1,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
    MPI_Allreduce(&local_50,&local_98,1,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_98;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_90;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x38) + 8);
    auVar18 = vfmadd213sd_fma(auVar17,auVar27,auVar35);
    local_a0 = auVar18._0_8_;
    if (*(int *)(in_RDI + 0x20) == 0) {
      poVar9 = std::operator<<((ostream *)&std::cout,"machine id ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(int *)(in_RDI + 0x20));
      poVar9 = std::operator<<(poVar9,", iter ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0);
      poVar9 = std::operator<<(poVar9,", rank ");
      poVar9 = std::operator<<(poVar9,"None");
      poVar9 = std::operator<<(poVar9,", time ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0);
      poVar9 = std::operator<<(poVar9," sec, loss ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_98);
      poVar9 = std::operator<<(poVar9,", obj ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_a0);
      poVar9 = std::operator<<(poVar9,", diff ");
      poVar9 = std::operator<<(poVar9,"None");
      poVar9 = std::operator<<(poVar9,", reg ");
      pvVar10 = (void *)std::ostream::operator<<(poVar9,local_90);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    }
    if (*(int *)(in_RDI + 0x20) == 0) {
      poVar9 = std::operator<<((ostream *)&std::cout,"RMSE of training data: ");
      dVar12 = sqrt(local_98 / (double)*(int *)(in_RDI + 0x10));
      pvVar10 = (void *)std::ostream::operator<<(poVar9,dVar12);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    }
  }
  Monitor::Monitor(&local_d8);
  local_e0 = 0.0;
  local_e4 = 1;
  do {
    if (*(int *)(*(long *)(in_RDI + 0x38) + 0x18) < local_e4) {
      poVar9 = std::operator<<((ostream *)&std::cout,"training time: ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_e0);
      poVar9 = std::operator<<(poVar9," secs");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      if (local_20 != (void *)0x0) {
        operator_delete__(local_20);
      }
      if (local_28 != (void *)0x0) {
        operator_delete__(local_28);
      }
      if (local_18 != (void *)0x0) {
        operator_delete__(local_18);
      }
      if (local_10 != (void *)0x0) {
        operator_delete__(local_10);
      }
      Monitor::~Monitor(&local_d8);
      return;
    }
    local_e8 = 0;
    local_f0 = 0.0;
    for (local_f4 = 0; local_f4 < **(int **)(in_RDI + 0x38); local_f4 = local_f4 + 1) {
      Monitor::start((Monitor *)0x1733a9);
      local_110 = *(long *)(in_RDI + 0x40) + (long)(local_f4 * *(int *)(in_RDI + 0x18)) * 8;
      local_118 = *(long *)(in_RDI + 0x48) + (long)(local_f4 * *(int *)(in_RDI + 0x1c)) * 8;
      init_factor(in_stack_fffffffffffffe20,(value_type_conflict1 *)in_stack_fffffffffffffe18,
                  (value_type_conflict1 *)in_stack_fffffffffffffe10,
                  (value_type_conflict1 *)in_stack_fffffffffffffe08,
                  (value_type_conflict1 *)in_stack_fffffffffffffe00);
      MPI_Allgather(local_110,*(undefined4 *)(in_RDI + 0x18),&ompi_mpi_double,local_20,
                    *(undefined4 *)(in_RDI + 0x18),&ompi_mpi_double,&ompi_mpi_comm_world);
      uVar5 = 0;
      MPI_Allgather(local_118,*(undefined4 *)(in_RDI + 0x1c),&ompi_mpi_double,local_28,
                    *(undefined4 *)(in_RDI + 0x1c),&ompi_mpi_double,&ompi_mpi_comm_world);
      if (4 < local_e8) break;
      if (1 < local_e4) {
        uVar41 = (undefined4)(uVar5 >> 0x20);
        update_rating((CCDPP_MPI *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      in_stack_fffffffffffffeb8,
                      (value_type_conflict1 *)
                      CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                      (value_type_conflict1 *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
                      in_stack_fffffffffffffea0,(bool)in_stack_fffffffffffffe9f);
        uVar5 = CONCAT44(uVar41,1);
        update_rating((CCDPP_MPI *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      in_stack_fffffffffffffeb8,
                      (value_type_conflict1 *)
                      CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                      (value_type_conflict1 *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
                      in_stack_fffffffffffffea0,(bool)in_stack_fffffffffffffe9f);
      }
      local_120 = 0.0;
      local_128 = 0.0;
      for (local_12c = 1; local_12c <= *(int *)(*(long *)(in_RDI + 0x38) + 0x1c);
          local_12c = local_12c + 1) {
        local_120 = 0.0;
        vVar13 = rank_one_update((CCDPP_MPI *)
                                 CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                 in_stack_fffffffffffffea8,
                                 (value_type_conflict1 *)
                                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                 (value_type_conflict1 *)
                                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                                 in_stack_fffffffffffffe94,in_stack_fffffffffffffe90,
                                 in_stack_fffffffffffffec0);
        local_120 = local_120 + vVar13;
        MPI_Allgather(local_118,*(undefined4 *)(in_RDI + 0x1c),&ompi_mpi_double,local_28,
                      *(undefined4 *)(in_RDI + 0x1c),&ompi_mpi_double,&ompi_mpi_comm_world);
        vVar13 = rank_one_update((CCDPP_MPI *)
                                 CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                 in_stack_fffffffffffffea8,
                                 (value_type_conflict1 *)
                                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                 (value_type_conflict1 *)
                                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                                 in_stack_fffffffffffffe94,in_stack_fffffffffffffe90,
                                 in_stack_fffffffffffffec0);
        local_120 = local_120 + vVar13;
        uVar5 = 0;
        MPI_Allgather(local_110,*(undefined4 *)(in_RDI + 0x18),&ompi_mpi_double,local_20,
                      *(undefined4 *)(in_RDI + 0x18),&ompi_mpi_double,&ompi_mpi_comm_world);
        MPI_Allreduce(&local_120,&local_128,1,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world
                     );
        if (local_128 < local_f0 * *(double *)(*(long *)(in_RDI + 0x38) + 0x10)) {
          if (local_12c == 1) {
            local_e8 = local_e8 + 1;
          }
          break;
        }
        if (((local_e4 != 1) || (local_f4 != 0)) || (local_12c != 1)) {
          pdVar11 = std::max<double>(&local_f0,&local_128);
          local_f0 = *pdVar11;
        }
      }
      uVar5 = uVar5 & 0xffffffff00000000;
      update_rating((CCDPP_MPI *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                    in_stack_fffffffffffffeb8,
                    (value_type_conflict1 *)
                    CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                    (value_type_conflict1 *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
                    in_stack_fffffffffffffea0,(bool)in_stack_fffffffffffffe9f);
      __k = (key_type *)(uVar5 & 0xffffffff00000000);
      local_138 = update_rating((CCDPP_MPI *)
                                CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                in_stack_fffffffffffffeb8,
                                (value_type_conflict1 *)
                                CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                (value_type_conflict1 *)in_stack_fffffffffffffea8,
                                in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,
                                (bool)in_stack_fffffffffffffe9f);
      Monitor::stop((Monitor *)0x17385c);
      dVar12 = Monitor::getElapsedTime((Monitor *)0x17386b);
      local_e0 = dVar12 + local_e0;
      auVar24 = ZEXT864((ulong)local_e0);
      if ((*(byte *)(*(long *)(in_RDI + 0x38) + 0x69) & 1) != 0) {
        for (in_stack_fffffffffffffec4 = 0; auVar18 = auVar24._0_16_,
            in_stack_fffffffffffffec4 < *(int *)(in_RDI + 0x34) - *(int *)(in_RDI + 0x30);
            in_stack_fffffffffffffec4 = in_stack_fffffffffffffec4 + 1) {
          in_stack_fffffffffffffeb4 = in_stack_fffffffffffffec4 + *(int *)(in_RDI + 0x30);
          pmVar6 = std::
                   unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                   ::operator[](in_stack_fffffffffffffd60,__k);
          sVar7 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  size(pmVar6);
          auVar18 = vcvtusi2sd_avx512f(auVar18,sVar7);
          in_stack_fffffffffffffeb8 = auVar18._0_8_;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = *(ulong *)(local_118 + (long)in_stack_fffffffffffffec4 * 8);
          auVar36._8_8_ = 0;
          auVar36._0_8_ = local_30;
          auVar28._8_8_ = 0;
          auVar28._0_8_ =
               (double)in_stack_fffffffffffffeb8 *
               *(double *)(local_118 + (long)in_stack_fffffffffffffec4 * 8);
          auVar18 = vfmadd213sd_fma(auVar19,auVar28,auVar36);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = *(ulong *)((long)local_18 + (long)in_stack_fffffffffffffec4 * 8);
          auVar37._8_8_ = 0;
          auVar37._0_8_ = auVar18._0_8_;
          auVar29._8_8_ = 0;
          auVar29._0_8_ =
               -((double)in_stack_fffffffffffffeb8 *
                *(double *)((long)local_18 + (long)in_stack_fffffffffffffec4 * 8));
          auVar18 = vfmadd213sd_fma(auVar20,auVar29,auVar37);
          auVar24 = ZEXT1664(auVar18);
          local_30 = auVar18._0_8_;
        }
        for (in_stack_fffffffffffffeb0 = 0; auVar18 = auVar24._0_16_,
            in_stack_fffffffffffffeb0 < *(int *)(in_RDI + 0x2c) - *(int *)(in_RDI + 0x28);
            in_stack_fffffffffffffeb0 = in_stack_fffffffffffffeb0 + 1) {
          in_stack_fffffffffffffea4 = in_stack_fffffffffffffeb0 + *(int *)(in_RDI + 0x28);
          pmVar6 = std::
                   unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                   ::operator[](in_stack_fffffffffffffd60,__k);
          sVar7 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  size(pmVar6);
          auVar18 = vcvtusi2sd_avx512f(auVar18,sVar7);
          in_stack_fffffffffffffea8 = auVar18._0_8_;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = *(ulong *)(local_110 + (long)in_stack_fffffffffffffeb0 * 8);
          auVar38._8_8_ = 0;
          auVar38._0_8_ = local_30;
          auVar30._8_8_ = 0;
          auVar30._0_8_ =
               (double)in_stack_fffffffffffffea8 *
               *(double *)(local_110 + (long)in_stack_fffffffffffffeb0 * 8);
          auVar18 = vfmadd213sd_fma(auVar21,auVar30,auVar38);
          auVar22._8_8_ = 0;
          auVar22._0_8_ = *(ulong *)((long)local_10 + (long)in_stack_fffffffffffffeb0 * 8);
          auVar39._8_8_ = 0;
          auVar39._0_8_ = auVar18._0_8_;
          auVar31._8_8_ = 0;
          auVar31._0_8_ =
               -((double)in_stack_fffffffffffffea8 *
                *(double *)((long)local_10 + (long)in_stack_fffffffffffffeb0 * 8));
          auVar18 = vfmadd213sd_fma(auVar22,auVar31,auVar39);
          auVar24 = ZEXT1664(auVar18);
          local_30 = auVar18._0_8_;
        }
        MPI_Allreduce(&local_30,&stack0xfffffffffffffe98,1,&ompi_mpi_double,&ompi_mpi_op_sum,
                      &ompi_mpi_comm_world);
        MPI_Allreduce(&local_138,&stack0xfffffffffffffe90,1,&ompi_mpi_double,&ompi_mpi_op_sum,
                      &ompi_mpi_comm_world);
        auVar40._4_4_ = in_stack_fffffffffffffe94;
        auVar40._0_4_ = in_stack_fffffffffffffe90;
        auVar40._8_8_ = 0;
        auVar32[7] = in_stack_fffffffffffffe9f;
        auVar32._0_7_ = in_stack_fffffffffffffe98;
        auVar32._8_8_ = 0;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x38) + 8);
        auVar18 = vfmadd213sd_fma(auVar23,auVar32,auVar40);
        dVar12 = auVar18._0_8_;
        if (*(int *)(in_RDI + 0x20) == 0) {
          poVar9 = std::operator<<((ostream *)&std::cout,"machine id ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(int *)(in_RDI + 0x20));
          in_stack_fffffffffffffe20 = (CCDPP_MPI *)std::operator<<(poVar9,", iter ");
          in_stack_fffffffffffffe18 =
               (ostream *)std::ostream::operator<<(in_stack_fffffffffffffe20,local_e4);
          in_stack_fffffffffffffe10 = std::operator<<(in_stack_fffffffffffffe18,", rank ");
          in_stack_fffffffffffffe08 =
               (ostream *)std::ostream::operator<<(in_stack_fffffffffffffe10,local_f4 + 1);
          in_stack_fffffffffffffe00 = std::operator<<(in_stack_fffffffffffffe08,", time ");
          dVar14 = Monitor::getElapsedTime((Monitor *)0x173ca7);
          poVar9 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffe00,dVar14);
          poVar9 = std::operator<<(poVar9," sec, loss ");
          poVar9 = (ostream *)
                   std::ostream::operator<<
                             (poVar9,(double)CONCAT44(in_stack_fffffffffffffe94,
                                                      in_stack_fffffffffffffe90));
          poVar9 = std::operator<<(poVar9,", obj ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar12);
          poVar9 = std::operator<<(poVar9,", diff ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_38 - dVar12);
          poVar9 = std::operator<<(poVar9,", reg ");
          pvVar10 = (void *)std::ostream::operator<<
                                      (poVar9,(double)CONCAT17(in_stack_fffffffffffffe9f,
                                                               in_stack_fffffffffffffe98));
          std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
        }
        local_38 = dVar12;
        if (*(int *)(in_RDI + 0x20) == 0) {
          poVar9 = std::operator<<((ostream *)&std::cout,"RMSE of training data: ");
          dVar12 = sqrt((double)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90) /
                        (double)*(int *)(in_RDI + 0x10));
          pvVar10 = (void *)std::ostream::operator<<(poVar9,dVar12);
          std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
        }
      }
    }
    local_e4 = local_e4 + 1;
  } while( true );
}

Assistant:

void train() {

        // only update the vectors belonging to this machines, but it will keep copies of all vectors from different machines
        value_type *last_q4d = new value_type[Q_workload];
        value_type *last_p4d = new value_type[P_workload];
        value_type *u = new value_type[user_num];
        value_type *v = new value_type[item_num];

        value_type reg = 0;
        value_type prev_obj = 0;

        if (parameter->verbose) {
            for (int d = 0; d < parameter->k; d++) {
                for (int user_index = 0; user_index < end_user_id - start_user_id; user_index++) {
                    // P is zero matrix at the beginning
                    reg += Q[d * Q_workload + user_index] * Q[d * Q_workload + user_index] * user_item_R[user_index + start_user_id].size();
                }
            }

            value_type loss = 0;
            for(auto rating:train_ratings){
                value_type score = rating.score;
                // P is zero matrix at the beginning
//                for (int d = 0; d < parameter->k; d++) {
//                    score -= Q[d * Q_workload + rating.user_id - start_user_id] * P[d * P_workload + rating.item_id - start_item_id];
//                }
                loss += score * score;
            }

            value_type global_reg, global_loss;

            MPI_Allreduce(&reg, &global_reg, 1, VALUE_MPI_TYPE, MPI_SUM, MPI_COMM_WORLD);
            MPI_Allreduce(&loss, &global_loss, 1, VALUE_MPI_TYPE, MPI_SUM, MPI_COMM_WORLD);

            value_type obj = global_loss + global_reg * parameter->lambda;

            if(machine_id==0) {
                cout << "machine id " << machine_id << ", iter " << 0 << ", rank " << "None"
                     << ", time " << 0
                     << " sec, loss " << global_loss << ", obj " << obj << ", diff " << "None"
                     << ", reg " << global_reg
                     << endl;
            }

            if(machine_id==0) {
                cout << "RMSE of training data: " << sqrt(global_loss / train_rating_num) << endl;
            }
        }

        Monitor timer;
        value_type total_training_time = 0;

        for (int outer_iter = 1; outer_iter <= parameter->max_iter; outer_iter++) {

            int early_stop = 0;

            value_type fundec_max = 0;

            for (int d = 0; d < parameter->k; d++) {

                timer.start();

                // the factors belonging to this machines
                value_type *q4d = Q + d * Q_workload;
                value_type *p4d = P + d * P_workload;

                init_factor(q4d, p4d, last_q4d, last_p4d);

                MPI_Allgather(q4d, Q_workload, VALUE_MPI_TYPE, u, Q_workload, VALUE_MPI_TYPE, MPI_COMM_WORLD);
                MPI_Allgather(p4d, P_workload, VALUE_MPI_TYPE, v, P_workload, VALUE_MPI_TYPE, MPI_COMM_WORLD);

                // it is not stated in the paper, but found in the implementation.
                if(early_stop >= 5) {
                    break;
                }

                // Create Rhat = user_item_R + Wt Ht^T
                if(outer_iter > 1){
                    update_rating(user_item_R, q4d, v, start_user_id, R_workload_update_rating, true);
                    update_rating(item_user_R, p4d, u, start_item_id, Rt_workload_update_rating, true);
                }

                value_type innerfundec_cur = 0;
                value_type global_innerfundec_cur = 0;

                for (int inner_iter = 1; inner_iter <= parameter->max_inner_iter; inner_iter++) {

                    innerfundec_cur = 0;

                    // Update W_t and H_t
                    // Note p should be updated first since it is 0 at the beginning
                    innerfundec_cur += rank_one_update(item_user_R, p4d, u, start_item_id, end_item_id, Rt_workload_rank_one_update);

                    MPI_Allgather(p4d, P_workload, VALUE_MPI_TYPE, v, P_workload, VALUE_MPI_TYPE, MPI_COMM_WORLD);

                    innerfundec_cur += rank_one_update(user_item_R, q4d, v, start_user_id, end_user_id, R_workload_rank_one_update);

                    MPI_Allgather(q4d, Q_workload, VALUE_MPI_TYPE, u, Q_workload, VALUE_MPI_TYPE, MPI_COMM_WORLD);

                    MPI_Allreduce(&innerfundec_cur, &global_innerfundec_cur, 1, VALUE_MPI_TYPE, MPI_SUM, MPI_COMM_WORLD);

                    if ((global_innerfundec_cur < fundec_max * parameter->eps)) {
                        if (inner_iter == 1) {
                            early_stop += 1;
                        }
                        break;
                    }

                    // the fundec of the first inner iter of the first rank of the first outer iteration could be too large!!
                    if(!(outer_iter==1 && d == 0 && inner_iter==1)) {
                        fundec_max = std::max(fundec_max, global_innerfundec_cur);
                    }

                }

                // Update user_item_R and item_user_R
                update_rating(user_item_R, q4d, v, start_user_id, R_workload_update_rating, false);
                value_type loss = update_rating(item_user_R, p4d, u, start_user_id, Rt_workload_update_rating, false);

                timer.stop();

                total_training_time += timer.getElapsedTime();

                if (parameter->verbose) {

                    for(int item_index = 0; item_index < end_item_id - start_item_id; item_index++) {
                        value_type c = item_user_R[item_index + start_item_id].size();
                        reg += c * p4d[item_index] * p4d[item_index];
                        reg -= c * last_p4d[item_index] * last_p4d[item_index];
                    }

                    for(int user_index = 0; user_index < end_user_id - start_user_id; user_index++) {
                        value_type c = user_item_R[user_index + start_user_id].size();
                        reg += c * q4d[user_index] * q4d[user_index];
                        reg -= c * last_q4d[user_index] * last_q4d[user_index];
                    }

                    value_type global_reg, global_loss;

                    MPI_Allreduce(&reg, &global_reg, 1, VALUE_MPI_TYPE, MPI_SUM, MPI_COMM_WORLD);
                    MPI_Allreduce(&loss, &global_loss, 1, VALUE_MPI_TYPE, MPI_SUM, MPI_COMM_WORLD);

                    value_type obj = global_loss + global_reg * parameter->lambda;

                    if(machine_id==0) {
                        cout << "machine id " << machine_id << ", iter " << outer_iter << ", rank " << d + 1
                             << ", time " << timer.getElapsedTime()
                             << " sec, loss " << global_loss << ", obj " << obj << ", diff " << prev_obj - obj
                             << ", reg " << global_reg
                             << endl;
                    }

                    prev_obj = obj;

                    if(machine_id==0) {
                        cout << "RMSE of training data: " << sqrt(global_loss / train_rating_num) << endl;
                    }
                }
            }
        }

        cout << "training time: " << total_training_time << " secs" << endl;

        delete[] u;
        delete[] v;
        delete[] last_p4d;
        delete[] last_q4d;

    }